

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O2

void binbuf_eval(_binbuf *x,t_pd *target,int argc,t_atom *argv)

{
  char **ppcVar1;
  uint uVar2;
  t_gpointer *gp;
  bool bVar3;
  int iVar4;
  long lVar5;
  word wVar6;
  t_symbol *ptVar7;
  t_atom *ptVar8;
  t_pd *pp_Var9;
  t_atom *ptVar10;
  uint uVar11;
  char *pcVar12;
  char *fmt;
  uint uVar13;
  uint uVar14;
  t_atom *a;
  t_atom *ptVar15;
  ulong uVar16;
  _class **x_00;
  t_atomtype tVar17;
  t_atomtype tVar18;
  t_float tVar19;
  t_atomtype tVar20;
  word awStack_3f30 [1999];
  undefined1 local_b8 [8];
  t_atom smallstack [5];
  t_atom *local_38;
  
  a = x->b_vec;
  uVar13 = x->b_n;
  uVar16 = (ulong)(int)uVar13;
  local_38 = (t_atom *)local_b8;
  ptVar10 = (t_atom *)local_b8;
  uVar14 = 0;
  if (5 < (long)uVar16) {
    if (target != &pd_objectmaker) {
      uVar14 = -(uint)(target == (t_pd *)0x0);
      uVar13 = 0;
      for (lVar5 = 0; uVar16 << 4 != lVar5; lVar5 = lVar5 + 0x10) {
        iVar4 = *(int *)((long)&a->a_type + lVar5);
        if (iVar4 == 4) {
          uVar14 = 0xffffffff;
        }
        else if (iVar4 == 5) {
          uVar14 = 0;
        }
        else {
          uVar11 = uVar14 + 1;
          bVar3 = (int)uVar13 <= (int)uVar14;
          uVar14 = uVar11;
          if (bVar3) {
            uVar13 = uVar11;
          }
        }
      }
      ptVar10 = (t_atom *)local_b8;
      uVar14 = uVar13;
      if ((int)uVar13 < 6) goto LAB_00162f6f;
    }
    uVar14 = uVar13;
    if (uVar13 < 1000) {
      local_38 = (t_atom *)(local_b8 + -(ulong)(uVar13 << 4));
      ptVar10 = local_38;
    }
    else {
      local_38 = (t_atom *)getbytes((ulong)uVar13 << 4);
      ptVar10 = (t_atom *)local_b8;
    }
  }
LAB_00162f6f:
  smallstack[4].a_w.w_binbuf = (_binbuf *)(argv + -1);
  pp_Var9 = target;
  do {
    while (uVar13 = (uint)uVar16, x_00 = pp_Var9, pp_Var9 == (t_pd *)0x0) {
      uVar13 = -uVar13;
      ptVar8 = a;
      while( true ) {
        ptVar8 = ptVar8 + 1;
        if (uVar13 == 0) goto LAB_001632e0;
        tVar17 = a->a_type;
        if ((tVar17 & ~A_FLOAT) != A_SEMI) break;
        a = a + 1;
        uVar13 = uVar13 + 1;
      }
      if (tVar17 == A_DOLLSYM) {
        ptVar7 = (a->a_w).w_symbol;
        ptVar10[-1].a_w.w_symbol = (t_symbol *)0x16322e;
        ptVar7 = binbuf_realizedollsym(ptVar7,argc,argv,0);
        if (ptVar7 != (t_symbol *)0x0) goto LAB_0016326a;
        pcVar12 = ((a->a_w).w_symbol)->s_name;
        fmt = "$%s: not enough arguments supplied";
LAB_00163290:
        ptVar10[-1].a_w.w_symbol = (t_symbol *)0x163297;
        pd_error(target,fmt,pcVar12);
      }
      else {
        if (tVar17 != A_DOLLAR) {
          ptVar10[-1].a_w.w_symbol = (t_symbol *)0x16324f;
          ptVar7 = atom_getsymbol(a);
LAB_0016326a:
          if (ptVar7->s_thing != (_class **)0x0) {
            a = a + 1;
            uVar13 = ~uVar13;
            x_00 = ptVar7->s_thing;
            break;
          }
          pcVar12 = ptVar7->s_name;
          fmt = "%s: no such object ";
          goto LAB_00163290;
        }
        uVar11 = (a->a_w).w_index;
        if ((int)uVar11 < 1 || argc < (int)uVar11) {
          pcVar12 = "$%d: not enough arguments supplied";
        }
        else {
          if (argv[(ulong)uVar11 - 1].a_type == A_SYMBOL) {
            ptVar7 = argv[(ulong)uVar11 - 1].a_w.w_symbol;
            goto LAB_0016326a;
          }
          pcVar12 = "$%d: symbol needed as message destination";
        }
        ptVar10[-1].a_w.w_symbol = (t_symbol *)0x1632ab;
        pd_error(target,pcVar12);
      }
      ptVar10[-1].a_w = (word)0xffffffffffffffff;
      uVar16 = *(ulong *)&ptVar10[-1].a_w;
      do {
        a = ptVar8;
        uVar11 = (uint)uVar16;
        if (uVar13 == uVar11) break;
        uVar16 = (ulong)(uVar11 - 1);
        ptVar8 = a + 1;
      } while (a->a_type != A_SEMI);
      uVar16 = (ulong)(uVar11 - uVar13);
      pp_Var9 = (t_pd *)0x0;
    }
    if (uVar13 == 0) {
LAB_001632e0:
      if (999 < (int)uVar14) {
        ptVar10[-1].a_w.w_symbol = (t_symbol *)0x1632f9;
        freebytes(local_38,(ulong)uVar14 << 4);
      }
      return;
    }
    ptVar8 = local_38;
    ptVar15 = a;
    for (uVar11 = 0; a = ptVar15 + 1, pp_Var9 = x_00, uVar2 = uVar13, uVar13 != uVar11;
        uVar11 = uVar11 + 1) {
      uVar2 = uVar11;
      switch(ptVar15->a_type) {
      case A_FLOAT:
      case A_SYMBOL:
        tVar17 = ptVar15->a_type;
        tVar18 = *(t_atomtype *)&ptVar15->field_0x4;
        tVar19 = (ptVar15->a_w).w_float;
        tVar20 = *(t_atomtype *)((long)&ptVar15->a_w + 4);
LAB_00162fee:
        ptVar8->a_type = tVar17;
        *(t_atomtype *)&ptVar8->field_0x4 = tVar18;
        (ptVar8->a_w).w_float = tVar19;
        *(t_atomtype *)((long)&ptVar8->a_w + 4) = tVar20;
        break;
      default:
        ptVar10[-1].a_w.w_symbol = (t_symbol *)0x1632e0;
        bug("bad item in binbuf");
        goto LAB_001632e0;
      case A_SEMI:
        if (x_00 == &pd_objectmaker) {
          ptVar8->a_type = A_SYMBOL;
          pcVar12 = ";";
          goto LAB_0016304d;
        }
        pp_Var9 = (t_pd *)0x0;
        goto LAB_001630fb;
      case A_COMMA:
        if (x_00 != &pd_objectmaker) goto LAB_001630fb;
        ptVar8->a_type = A_SYMBOL;
        pcVar12 = ",";
LAB_0016304d:
        ptVar10[-1].a_w.w_symbol = (t_symbol *)0x163052;
        wVar6.w_symbol = gensym(pcVar12);
LAB_00163052:
        (ptVar8->a_w).w_symbol = (t_symbol *)wVar6;
        break;
      case A_DOLLAR:
        uVar2 = (ptVar15->a_w).w_index;
        if ((int)uVar2 <= argc && 0 < (int)uVar2) {
          ppcVar1 = &(smallstack[4].a_w.w_symbol)->s_name + (ulong)uVar2 * 2;
          tVar17 = *(t_atomtype *)ppcVar1;
          tVar18 = *(t_atomtype *)((long)ppcVar1 + 4);
          tVar19 = *(t_float *)(ppcVar1 + 1);
          tVar20 = *(t_atomtype *)((long)ppcVar1 + 0xc);
          goto LAB_00162fee;
        }
        if ((ulong)uVar2 == 0) {
          ptVar8->a_type = A_FLOAT;
          ptVar10[-1].a_w.w_symbol = (t_symbol *)0x1630e7;
          iVar4 = canvas_getdollarzero();
          (ptVar8->a_w).w_float = (float)iVar4;
        }
        else {
          if (x_00 != &pd_objectmaker) {
            ptVar10[-1].a_w.w_symbol = (t_symbol *)0x163098;
            pd_error(x_00,"$%d: argument number out of range");
          }
          ptVar8->a_type = A_FLOAT;
          (ptVar8->a_w).w_float = 0.0;
        }
        break;
      case A_DOLLSYM:
        ptVar7 = (ptVar15->a_w).w_symbol;
        ptVar10[-1].a_w.w_symbol = (t_symbol *)0x163006;
        wVar6.w_symbol = binbuf_realizedollsym(ptVar7,argc,argv,(uint)(x_00 == &pd_objectmaker));
        if (wVar6.w_symbol == (t_symbol *)0x0) {
          pcVar12 = ((ptVar15->a_w).w_symbol)->s_name;
          ptVar10[-1].a_w.w_symbol = (t_symbol *)0x1630cd;
          pd_error(x_00,"%s: argument number out of range",pcVar12);
          ptVar8->a_type = A_SYMBOL;
          wVar6 = ptVar15->a_w;
        }
        else {
          ptVar8->a_type = A_SYMBOL;
        }
        goto LAB_00163052;
      }
      ptVar8 = ptVar8 + 1;
      ptVar15 = a;
    }
LAB_001630fb:
    if (uVar2 != 0) {
      tVar17 = local_38->a_type;
      if (tVar17 == A_FLOAT) {
        if (uVar2 == 1) {
          tVar19 = (local_38->a_w).w_float;
          ptVar10[-1].a_w.w_symbol = (t_symbol *)0x1631d3;
          pd_float(x_00,tVar19);
        }
        else {
LAB_001631d5:
          ptVar10[-1].a_w.w_symbol = (t_symbol *)0x1631e3;
          pd_list(x_00,(t_symbol *)0x0,uVar2,local_38);
        }
      }
      else if (tVar17 == A_POINTER) {
        if (uVar2 != 1) goto LAB_001631d5;
        gp = (local_38->a_w).w_gpointer;
        ptVar10[-1].a_w.w_symbol = (t_symbol *)0x1631bb;
        pd_pointer(x_00,gp);
      }
      else if (tVar17 == A_SYMBOL) {
        ptVar7 = (local_38->a_w).w_symbol;
        ptVar10[-1].a_w.w_symbol = (t_symbol *)0x16313a;
        pd_typedmess(x_00,ptVar7,uVar2 - 1,local_38 + 1);
      }
      else {
        ptVar10[-1].a_w.w_symbol = (t_symbol *)0x1631f3;
        bug("bad selector");
      }
    }
    if (uVar13 == uVar11) goto LAB_001632e0;
    uVar16 = (ulong)(~uVar11 + uVar13);
  } while( true );
}

Assistant:

void binbuf_eval(const t_binbuf *x, t_pd *target, int argc, const t_atom *argv)
{
    t_atom smallstack[SMALLMSG], *mstack, *msp;
    const t_atom *at = x->b_vec;
    int ac = x->b_n;
    int nargs, maxnargs = 0;
    t_pd *initial_target = target;

    if (ac <= SMALLMSG)
        mstack = smallstack;
    else
    {
#if 1
            /* count number of args in biggest message.  The weird
            treatment of "pd_objectmaker" is because when the message
            goes out to objectmaker, commas and semis are passed
            on as regular args (see below).  We're tacitly assuming here
            that the pd_objectmaker target can't come up via a named
            destination in the message, only because the original "target"
            points there. */
        if (target == &pd_objectmaker)
            maxnargs = ac;
        else
        {
            int i, j = (target ? 0 : -1);
            for (i = 0; i < ac; i++)
            {
                if (at[i].a_type == A_SEMI)
                    j = -1;
                else if (at[i].a_type == A_COMMA)
                    j = 0;
                else if (++j > maxnargs)
                    maxnargs = j;
            }
        }
        if (maxnargs <= SMALLMSG)
            mstack = smallstack;
        else ATOMS_ALLOCA(mstack, maxnargs);
#else
            /* just pessimistically allocate enough to hold everything
            at once.  This turned out to run slower in a simple benchmark
            I tried, perhaps because the extra memory allocation
            hurt the cache hit rate. */
        maxnargs = ac;
        ATOMS_ALLOCA(mstack, maxnargs);
#endif

    }
    msp = mstack;
    while (1)
    {
        t_pd *nexttarget;
            /* get a target. */
        while (!target)
        {
            t_symbol *s;
            while (ac && (at->a_type == A_SEMI || at->a_type == A_COMMA))
                ac--,  at++;
            if (!ac) break;
            if (at->a_type == A_DOLLAR)
            {
                if (at->a_w.w_index <= 0 || at->a_w.w_index > argc)
                {
                    pd_error(initial_target, "$%d: not enough arguments supplied",
                            at->a_w.w_index);
                    goto cleanup;
                }
                else if (argv[at->a_w.w_index-1].a_type != A_SYMBOL)
                {
                    pd_error(initial_target, "$%d: symbol needed as message destination",
                        at->a_w.w_index);
                    goto cleanup;
                }
                else s = argv[at->a_w.w_index-1].a_w.w_symbol;
            }
            else if (at->a_type == A_DOLLSYM)
            {
                if (!(s = binbuf_realizedollsym(at->a_w.w_symbol,
                    argc, argv, 0)))
                {
                    pd_error(initial_target, "$%s: not enough arguments supplied",
                        at->a_w.w_symbol->s_name);
                    goto cleanup;
                }
            }
            else s = atom_getsymbol(at);
            if (!(target = s->s_thing))
            {
                pd_error(initial_target, "%s: no such object ", s->s_name);
            cleanup:
                do at++, ac--;
                while (ac && at->a_type != A_SEMI);
                    /* LATER eat args until semicolon and continue */
                continue;
            }
            else
            {
                at++, ac--;
                break;
            }
        }
        if (!ac) break;
        nargs = 0;
        nexttarget = target;
        while (1)
        {
            t_symbol *s9;
            if (!ac) goto gotmess;
            switch (at->a_type)
            {
            case A_SEMI:
                    /* semis and commas in new message just get bashed to
                    a symbol.  This is needed so you can pass them to "expr." */
                if (target == &pd_objectmaker)
                {
                    SETSYMBOL(msp, gensym(";"));
                    break;
                }
                else
                {
                    nexttarget = 0;
                    goto gotmess;
                }
            case A_COMMA:
                if (target == &pd_objectmaker)
                {
                    SETSYMBOL(msp, gensym(","));
                    break;
                }
                else goto gotmess;
            case A_FLOAT:
            case A_SYMBOL:
                *msp = *at;
                break;
            case A_DOLLAR:
                if (at->a_w.w_index > 0 && at->a_w.w_index <= argc)
                    *msp = argv[at->a_w.w_index-1];
                else if (at->a_w.w_index == 0)
                    SETFLOAT(msp, canvas_getdollarzero());
                else
                {
                    if (target == &pd_objectmaker)
                        SETFLOAT(msp, 0);
                    else
                    {
                        pd_error(target, "$%d: argument number out of range",
                            at->a_w.w_index);
                        SETFLOAT(msp, 0);
                    }
                }
                break;
            case A_DOLLSYM:
                s9 = binbuf_realizedollsym(at->a_w.w_symbol, argc, argv,
                    target == &pd_objectmaker);
                if (!s9)
                {
                    pd_error(target, "%s: argument number out of range", at->a_w.w_symbol->s_name);
                    SETSYMBOL(msp, at->a_w.w_symbol);
                }
                else SETSYMBOL(msp, s9);
                break;
            default:
                bug("bad item in binbuf");
                goto broken;
            }
            msp++;
            ac--;
            at++;
            nargs++;
        }
    gotmess:
        if (nargs)
        {
            switch (mstack->a_type)
            {
            case A_SYMBOL:
                typedmess(target, mstack->a_w.w_symbol, nargs-1, mstack+1);
                break;
            case A_FLOAT:
                if (nargs == 1) pd_float(target, mstack->a_w.w_float);
                else pd_list(target, 0, nargs, mstack);
                break;
            case A_POINTER:
                if (nargs == 1) pd_pointer(target, mstack->a_w.w_gpointer);
                else pd_list(target, 0, nargs, mstack);
                break;
            default:
                bug("bad selector");
                break;
            }
        }
        msp = mstack;
        if (!ac) break;
        target = nexttarget;
        at++;
        ac--;
    }
broken:
    if (maxnargs > SMALLMSG)
         ATOMS_FREEA(mstack, maxnargs);
}